

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_count_which(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  CVmRun *this;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t *val;
  int val_cnt;
  size_t idx;
  size_t cnt;
  vm_rcdesc rc;
  vm_val_t *func_val;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  uint *in_stack_ffffffffffffff50;
  vm_val_t *lst_00;
  vm_rcdesc *in_stack_ffffffffffffff58;
  uint argc_00;
  CVmRun *funcptr;
  uint *in_stack_ffffffffffffff78;
  vm_val_t *in_stack_ffffffffffffff80;
  unsigned_short in_stack_ffffffffffffff8e;
  vm_val_t *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  vm_rcdesc *in_stack_ffffffffffffffa0;
  
  if ((getp_count_which(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_count_which(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_count_which::desc,1);
    __cxa_guard_release(&getp_count_which(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                       );
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (iVar1 == 0) {
    CVmStack::get(0);
    lst_00 = in_RSI;
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8e,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    CVmStack::push(in_RSI);
    this = (CVmRun *)vmb_get_len((char *)0x36d81a);
    vm_val_t::set_nil(in_RDI);
    argc_00 = 0;
    for (funcptr = (CVmRun *)0x1; funcptr <= this;
        funcptr = (CVmRun *)((long)&(funcptr->super_CVmStack).arr_ + 1)) {
      index_and_push((char *)lst_00,in_stack_ffffffffffffff4c);
      CVmRun::call_func_ptr
                (this,(vm_val_t *)funcptr,argc_00,in_stack_ffffffffffffff58,
                 (uint)((ulong)lst_00 >> 0x20));
      in_stack_ffffffffffffff58 = (vm_rcdesc *)CVmRun::get_r0();
      if ((*(vm_datatype_t *)&in_stack_ffffffffffffff58->argp != VM_NIL) &&
         ((*(vm_datatype_t *)&in_stack_ffffffffffffff58->argp != VM_INT ||
          (((anon_union_8_8_cb74652f_for_val *)&in_stack_ffffffffffffff58->argc)->obj != 0)))) {
        argc_00 = argc_00 + 1;
      }
    }
    CVmStack::discard(2);
    vm_val_t::set_int(in_RDI,argc_00);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_count_which(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *lst, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    const vm_val_t *func_val = G_stk->get(0);

    /* set up a native callback descriptor */
    vm_rcdesc rc(vmg_ "List.countWhich", self_val, 16, G_stk->get(0), argc);

    /* push a self-reference while allocating to protect from gc */
    G_stk->push(self_val);

    /* get the length of the list */
    size_t cnt = vmb_get_len(lst);

    /* no return value */
    retval->set_nil();

    /* invoke the callback on each element */
    size_t idx;
    int val_cnt;
    for (idx = 1, val_cnt = 0 ; idx <= cnt ; ++idx)
    {
        vm_val_t *val;

        /* re-translate the list address in case of swapping */
        VM_IF_SWAPPING_POOL(if (self_val->typ == VM_LIST)
            lst = self_val->get_as_list(vmg0_);)

        /* 
         *   get this element (using a 1-based index), and push it as the
         *   callback's argument 
         */
        index_and_push(vmg_ lst, idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* get the result from R0 */
        val = G_interpreter->get_r0();

        /* if the callback returned non-nil and non-zero, count it */
        if (val->typ == VM_NIL
            || (val->typ == VM_INT && val->val.intval == 0))
        {
            /* it's nil or zero - don't include it in the result */
        }
        else
        {
            /* count it */
            ++val_cnt;
        }
    }

    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* return the count */
    retval->set_int(val_cnt);

    /* handled */
    return TRUE;
}